

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O2

Aig_Obj_t *
Kit_TruthToAig(Aig_Man_t *pMan,Aig_Obj_t **pFanins,uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_00;
  Aig_Obj_t *pAVar1;
  
  if (vMemory == (Vec_Int_t *)0x0) {
    vMemory_00 = (Vec_Int_t *)calloc(1,0x10);
    pGraph = Kit_TruthToGraph(pTruth,nVars,vMemory_00);
    free(vMemory_00->pArray);
    free(vMemory_00);
  }
  else {
    pGraph = Kit_TruthToGraph(pTruth,nVars,vMemory);
  }
  pAVar1 = Kit_GraphToAig(pMan,pFanins,pGraph);
  Kit_GraphFree(pGraph);
  return pAVar1;
}

Assistant:

Aig_Obj_t * Kit_TruthToAig( Aig_Man_t * pMan, Aig_Obj_t ** pFanins, unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Aig_Obj_t * pObj;
    Kit_Graph_t * pGraph;
    // transform truth table into the decomposition tree
    if ( vMemory == NULL )
    {
        vMemory = Vec_IntAlloc( 0 );
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
        Vec_IntFree( vMemory );
    }
    else
        pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    // derive the AIG for the decomposition tree
    pObj = Kit_GraphToAig( pMan, pFanins, pGraph );
    Kit_GraphFree( pGraph );
    return pObj;
}